

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O3

void emitter_kv_note(emitter_t *emitter,char *json_key,char *table_key,emitter_type_t value_type,
                    void *value,char *table_note_key,emitter_type_t table_note_value_type,
                    void *table_note_value)

{
  emitter_output_t eVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  
  eVar1 = emitter->output;
  if (emitter_output_json_compact < eVar1) {
    if (eVar1 == emitter_output_table) {
      if (0 < emitter->nesting_depth) {
        iVar4 = emitter->nesting_depth * 2;
        do {
          emitter_printf(emitter,"%s"," ");
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      emitter_printf(emitter,"%s: ",table_key);
      emitter_print_value(emitter,emitter_justify_none,-1,value_type,value);
      if (table_note_key != (char *)0x0) {
        emitter_printf(emitter," (%s: ",table_note_key);
        emitter_print_value(emitter,emitter_justify_none,-1,table_note_value_type,table_note_value);
        emitter_printf(emitter,")");
      }
      emitter_printf(emitter,anon_var_dwarf_63f1717 + 8);
    }
    goto LAB_01180a9a;
  }
  if (emitter->emitted_key == true) {
    emitter->emitted_key = false;
LAB_01180a4d:
    if (eVar1 == emitter_output_json_compact) goto LAB_01180a52;
    pcVar2 = " ";
  }
  else {
    if (emitter->item_at_depth == true) {
      emitter_printf(emitter,",");
      eVar1 = emitter->output;
    }
    if (eVar1 != emitter_output_json_compact) {
      emitter_printf(emitter,anon_var_dwarf_63f1717 + 8);
      eVar1 = emitter->output;
      pcVar2 = anon_var_dwarf_63f1aec + 7;
      if (eVar1 != emitter_output_json) {
        pcVar2 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar3 = emitter->nesting_depth << (eVar1 != emitter_output_json);
        iVar4 = 1;
        if (1 < iVar3) {
          iVar4 = iVar3;
        }
        do {
          emitter_printf(emitter,"%s",pcVar2);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        eVar1 = emitter->output;
      }
      goto LAB_01180a4d;
    }
LAB_01180a52:
    pcVar2 = anon_var_dwarf_63f17de + 9;
  }
  emitter_printf(emitter,"\"%s\":%s",json_key,pcVar2);
  emitter->emitted_key = true;
  if (emitter->output < emitter_output_table) {
    emitter->emitted_key = false;
    emitter_print_value(emitter,emitter_justify_none,-1,value_type,value);
  }
LAB_01180a9a:
  emitter->item_at_depth = true;
  return;
}

Assistant:

static inline void
emitter_kv_note(emitter_t *emitter, const char *json_key, const char *table_key,
    emitter_type_t value_type, const void *value,
    const char *table_note_key, emitter_type_t table_note_value_type,
    const void *table_note_value) {
	if (emitter_outputs_json(emitter)) {
		emitter_json_key(emitter, json_key);
		emitter_json_value(emitter, value_type, value);
	} else {
		emitter_table_kv_note(emitter, table_key, value_type, value,
		    table_note_key, table_note_value_type, table_note_value);
	}
	emitter->item_at_depth = true;
}